

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_log.h
# Opt level: O0

void __thiscall Kumu::ILogSink::WriteEntryToListeners(ILogSink *this,LogEntry *entry)

{
  bool bVar1;
  reference ppIVar2;
  _Self local_30;
  _Base_ptr local_28;
  _Rb_tree_const_iterator<Kumu::ILogSink_*> local_20;
  iterator i;
  LogEntry *entry_local;
  ILogSink *this_local;
  
  i._M_node = (_Base_ptr)entry;
  std::_Rb_tree_const_iterator<Kumu::ILogSink_*>::_Rb_tree_const_iterator(&local_20);
  local_28 = (_Base_ptr)
             std::
             set<Kumu::ILogSink_*,_std::less<Kumu::ILogSink_*>,_std::allocator<Kumu::ILogSink_*>_>::
             begin(&this->m_listeners);
  local_20._M_node = local_28;
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::set<Kumu::ILogSink_*,_std::less<Kumu::ILogSink_*>,_std::allocator<Kumu::ILogSink_*>_>
         ::end(&this->m_listeners);
    bVar1 = std::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    ppIVar2 = std::_Rb_tree_const_iterator<Kumu::ILogSink_*>::operator*(&local_20);
    (*(*ppIVar2)->_vptr_ILogSink[3])(*ppIVar2,i._M_node);
    std::_Rb_tree_const_iterator<Kumu::ILogSink_*>::operator++(&local_20);
  }
  return;
}

Assistant:

void WriteEntryToListeners(const LogEntry& entry)
      {
	std::set<ILogSink*>::iterator i;
	for ( i = m_listeners.begin(); i != m_listeners.end(); ++i )
	  (*i)->WriteEntry(entry);
      }